

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFInterpolater.cpp
# Opt level: O2

Box * __thiscall
amrex::MFCellConsLinInterp::CoarseBox
          (Box *__return_storage_ptr__,MFCellConsLinInterp *this,Box *fine,IntVect *ratio)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int dir;
  long lVar10;
  int local_14 [3];
  
  uVar4 = *(undefined8 *)(fine->smallend).vect;
  uVar5 = *(undefined8 *)((fine->smallend).vect + 2);
  uVar6 = *(undefined8 *)((fine->bigend).vect + 2);
  *(undefined8 *)(__return_storage_ptr__->bigend).vect = *(undefined8 *)(fine->bigend).vect;
  *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = uVar6;
  *(undefined8 *)(__return_storage_ptr__->smallend).vect = uVar4;
  *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) = uVar5;
  iVar1 = ratio->vect[0];
  iVar2 = ratio->vect[1];
  if (iVar2 == 1 && iVar1 == 1) {
    if (ratio->vect[2] == 1) goto LAB_00455d8a;
    uVar7 = (__return_storage_ptr__->smallend).vect[1];
  }
  else {
    uVar7 = (__return_storage_ptr__->smallend).vect[0];
    if (iVar1 != 1) {
      if (iVar1 == 4) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 2;
        }
        else {
          uVar7 = uVar7 >> 2;
        }
      }
      else if (iVar1 == 2) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 1;
        }
        else {
          uVar7 = uVar7 >> 1;
        }
      }
      else if ((int)uVar7 < 0) {
        uVar7 = ~((int)~uVar7 / iVar1);
      }
      else {
        uVar7 = (int)uVar7 / iVar1;
      }
    }
    (__return_storage_ptr__->smallend).vect[0] = uVar7;
    uVar7 = (__return_storage_ptr__->smallend).vect[1];
    if (iVar2 != 1) {
      if (iVar2 == 4) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 2;
        }
        else {
          uVar7 = uVar7 >> 2;
        }
      }
      else if (iVar2 == 2) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 1;
        }
        else {
          uVar7 = uVar7 >> 1;
        }
      }
      else if ((int)uVar7 < 0) {
        uVar7 = ~((int)~uVar7 / iVar2);
      }
      else {
        uVar7 = (int)uVar7 / iVar2;
      }
    }
  }
  (__return_storage_ptr__->smallend).vect[1] = uVar7;
  uVar7 = (__return_storage_ptr__->smallend).vect[2];
  iVar3 = ratio->vect[2];
  if (iVar3 != 1) {
    if (iVar3 == 4) {
      if ((int)uVar7 < 0) {
        uVar7 = (int)uVar7 >> 2;
      }
      else {
        uVar7 = uVar7 >> 2;
      }
    }
    else if (iVar3 == 2) {
      if ((int)uVar7 < 0) {
        uVar7 = (int)uVar7 >> 1;
      }
      else {
        uVar7 = uVar7 >> 1;
      }
    }
    else if ((int)uVar7 < 0) {
      uVar7 = ~((int)~uVar7 / iVar3);
    }
    else {
      uVar7 = (int)uVar7 / iVar3;
    }
  }
  (__return_storage_ptr__->smallend).vect[2] = uVar7;
  uVar7 = (__return_storage_ptr__->btype).itype;
  if (uVar7 == 0) {
    uVar7 = (__return_storage_ptr__->bigend).vect[0];
    if (iVar1 != 1) {
      if (iVar1 == 4) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 2;
        }
        else {
          uVar7 = uVar7 >> 2;
        }
      }
      else if (iVar1 == 2) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 1;
        }
        else {
          uVar7 = uVar7 >> 1;
        }
      }
      else if ((int)uVar7 < 0) {
        uVar7 = ~((int)~uVar7 / iVar1);
      }
      else {
        uVar7 = (int)uVar7 / iVar1;
      }
    }
    (__return_storage_ptr__->bigend).vect[0] = uVar7;
    uVar7 = (__return_storage_ptr__->bigend).vect[1];
    if (iVar2 != 1) {
      if (iVar2 == 4) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 2;
        }
        else {
          uVar7 = uVar7 >> 2;
        }
      }
      else if (iVar2 == 2) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 1;
        }
        else {
          uVar7 = uVar7 >> 1;
        }
      }
      else if ((int)uVar7 < 0) {
        uVar7 = ~((int)~uVar7 / iVar2);
      }
      else {
        uVar7 = (int)uVar7 / iVar2;
      }
    }
    (__return_storage_ptr__->bigend).vect[1] = uVar7;
    uVar7 = (__return_storage_ptr__->bigend).vect[2];
    if (iVar3 != 1) {
      if (iVar3 == 4) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 2;
        }
        else {
          uVar7 = uVar7 >> 2;
        }
      }
      else if (iVar3 == 2) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 1;
        }
        else {
          uVar7 = uVar7 >> 1;
        }
      }
      else if ((int)uVar7 < 0) {
        uVar7 = ~((int)~uVar7 / iVar3);
      }
      else {
        uVar7 = (int)uVar7 / iVar3;
      }
    }
  }
  else {
    local_14[0] = 0;
    local_14[1] = 0;
    local_14[2] = 0;
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      if (((uVar7 >> ((uint)lVar10 & 0x1f) & 1) != 0) &&
         ((__return_storage_ptr__->bigend).vect[lVar10] % ratio->vect[lVar10] != 0)) {
        local_14[lVar10] = 1;
      }
    }
    uVar8 = (__return_storage_ptr__->bigend).vect[0];
    if (iVar1 != 1) {
      if (iVar1 == 4) {
        if ((int)uVar8 < 0) {
          uVar8 = (int)uVar8 >> 2;
        }
        else {
          uVar8 = uVar8 >> 2;
        }
      }
      else if (iVar1 == 2) {
        if ((int)uVar8 < 0) {
          uVar8 = (int)uVar8 >> 1;
        }
        else {
          uVar8 = uVar8 >> 1;
        }
      }
      else if ((int)uVar8 < 0) {
        uVar8 = ~((int)~uVar8 / iVar1);
      }
      else {
        uVar8 = (int)uVar8 / iVar1;
      }
    }
    uVar9 = (__return_storage_ptr__->bigend).vect[1];
    if (iVar2 != 1) {
      if (iVar2 == 4) {
        if ((int)uVar9 < 0) {
          uVar9 = (int)uVar9 >> 2;
        }
        else {
          uVar9 = uVar9 >> 2;
        }
      }
      else if (iVar2 == 2) {
        if ((int)uVar9 < 0) {
          uVar9 = (int)uVar9 >> 1;
        }
        else {
          uVar9 = uVar9 >> 1;
        }
      }
      else if ((int)uVar9 < 0) {
        uVar9 = ~((int)~uVar9 / iVar2);
      }
      else {
        uVar9 = (int)uVar9 / iVar2;
      }
    }
    uVar7 = (__return_storage_ptr__->bigend).vect[2];
    if (iVar3 != 1) {
      if (iVar3 == 4) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 2;
        }
        else {
          uVar7 = uVar7 >> 2;
        }
      }
      else if (iVar3 == 2) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 1;
        }
        else {
          uVar7 = uVar7 >> 1;
        }
      }
      else if ((int)uVar7 < 0) {
        uVar7 = ~((int)~uVar7 / iVar3);
      }
      else {
        uVar7 = (int)uVar7 / iVar3;
      }
    }
    (__return_storage_ptr__->bigend).vect[0] = uVar8 + local_14[0];
    (__return_storage_ptr__->bigend).vect[1] = uVar9 + local_14[1];
    uVar7 = uVar7 + local_14[2];
  }
  (__return_storage_ptr__->bigend).vect[2] = uVar7;
LAB_00455d8a:
  Box::grow(__return_storage_ptr__,1);
  return __return_storage_ptr__;
}

Assistant:

Box
MFCellConsLinInterp::CoarseBox (const Box& fine, const IntVect& ratio)
{
    Box crse = amrex::coarsen(fine,ratio);
    crse.grow(1);
    return crse;
}